

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaANCF_3813_9.cpp
# Opt level: O2

void __thiscall
chrono::fea::Brick9_Mass::Evaluate
          (Brick9_Mass *this,ChMatrixNM<double,_33,_33> *result,double x,double y,double z)

{
  Scalar SVar1;
  Scalar *pSVar2;
  Scalar *pSVar3;
  long col;
  int i;
  long index;
  DenseBase<Eigen::Matrix<double,_3,_33,_1,_3,_33>_> *local_408;
  double local_400;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_33,_3,_0,_33,_3>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_33,_1,_3,_33>_>_>
  local_3f8;
  Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_33,_3,_0,_33,_3>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_33,_1,_3,_33>_>_>,_Eigen::Matrix<double,_3,_33,_1,_3,_33>,_0>
  local_3d0;
  ShapeVector N;
  ChMatrixNM<double,_3,_33> S;
  
  ChElementHexaANCF_3813_9::ShapeFunctions(this->m_element,&N,x,y,z);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_33,_1,_3,_33>_>::setZero
            ((DenseBase<Eigen::Matrix<double,_3,_33,_1,_3,_33>_> *)&S);
  col = 0;
  for (index = 0; index != 0xb; index = index + 1) {
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>,_1> *)&N,index);
    SVar1 = *pSVar2;
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_33,_1,_3,_33>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_33,_1,_3,_33>,_1> *)&S,0,col);
    *pSVar3 = SVar1;
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>,_1> *)&N,index);
    SVar1 = *pSVar2;
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_33,_1,_3,_33>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_33,_1,_3,_33>,_1> *)&S,1,col + 1);
    *pSVar3 = SVar1;
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>,_1> *)&N,index);
    SVar1 = *pSVar2;
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_33,_1,_3,_33>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_33,_1,_3,_33>,_1> *)&S,2,col + 2);
    col = col + 3;
    *pSVar3 = SVar1;
  }
  local_400 = ChElementHexaANCF_3813_9::Calc_detJ0(this->m_element,x,y,z);
  local_400 = local_400 * this->m_element->m_GaussScaling;
  local_408 = (DenseBase<Eigen::Matrix<double,_3,_33,_1,_3,_33>_> *)&S;
  Eigen::operator*(&local_3f8,&local_400,(StorageBaseType *)&local_408);
  local_3d0.m_lhs.m_lhs.m_functor.m_other = local_3f8.m_lhs.m_functor.m_other;
  local_3d0.m_lhs.m_rhs.m_matrix = local_3f8.m_rhs.m_matrix;
  local_3d0.m_rhs = (RhsNested)&S;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,33,33,1,33,33>,Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,33,3,0,33,3>const>const,Eigen::Transpose<Eigen::Matrix<double,3,33,1,3,33>>const>,Eigen::Matrix<double,3,33,1,3,33>,0>>
            (result,&local_3d0);
  return;
}

Assistant:

void Brick9_Mass::Evaluate(ChMatrixNM<double, 33, 33>& result, const double x, const double y, const double z) {
    ChElementHexaANCF_3813_9::ShapeVector N;
    m_element->ShapeFunctions(N, x, y, z);

    ChMatrixNM<double, 3, 33> S;
    S.setZero();

    for (int i = 0; i < 11; i++) {
        S(0, 3 * i + 0) = N(i);
        S(1, 3 * i + 1) = N(i);
        S(2, 3 * i + 2) = N(i);
    }

    double detJ0 = m_element->Calc_detJ0(x, y, z);

    // perform  r = S'*S
    result = detJ0 * m_element->m_GaussScaling * S.transpose() * S;
}